

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.h
# Opt level: O2

_influence<unsigned_int,_float> * __thiscall
xray_re::xr_flexbuf::duplicate<xray_re::_influence<unsigned_int,float>>
          (xr_flexbuf *this,_influence<unsigned_int,_float> *source)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _influence<unsigned_int,_float> *p_Var8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  
  if (source == (_influence<unsigned_int,_float> *)0x0) {
    p_Var8 = (_influence<unsigned_int,_float> *)0x0;
  }
  else {
    uVar3 = this->m_size;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar3;
    uVar11 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x24),8) == 0) {
      uVar11 = SUB168(auVar4 * ZEXT816(0x24),0);
    }
    p_Var8 = (_influence<unsigned_int,_float> *)operator_new__(uVar11);
    if (uVar3 == 0) {
      sVar9 = 0;
    }
    else {
      lVar10 = 0;
      do {
        _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::_svector
                  ((_svector<xray_re::_bone_weight<unsigned_int,_float>,_4U> *)
                   ((long)&(p_Var8->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                           array[0].bone + lVar10));
        lVar10 = lVar10 + 0x24;
      } while (uVar3 * 0x24 - lVar10 != 0);
      sVar9 = this->m_size;
    }
    for (lVar10 = 0; sVar9 * 0x24 - lVar10 != 0; lVar10 = lVar10 + 0x24) {
      puVar1 = (undefined8 *)
               ((long)&(source->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                       array[0].bone + lVar10);
      puVar2 = (undefined8 *)
               ((long)&(p_Var8->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                       array[0].bone + lVar10);
      *(undefined4 *)(puVar2 + 4) = *(undefined4 *)(puVar1 + 4);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      uVar7 = puVar1[3];
      puVar2[2] = puVar1[2];
      puVar2[3] = uVar7;
      *puVar2 = uVar5;
      puVar2[1] = uVar6;
    }
  }
  return p_Var8;
}

Assistant:

inline T* xr_flexbuf::duplicate(const T* source) const
{
	return source ? copy(source, new T[m_size], m_size) : 0;
}